

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListTest::executeDrawCall
          (XFBStrideOfEmptyListTest *this,GLuint test_case_index)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar4;
  
  iVar2 = (*((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x4e8))(0x8c89);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Disable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x4dc8);
  (**(code **)(lVar4 + 0x30))(0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  local_1b8.m_value = dVar3;
  if (test_case_index == 2) {
    if (dVar3 == 0x502) {
      return true;
    }
    if (dVar3 == 0) {
      (**(code **)(lVar4 + 0x638))();
    }
    local_1a8._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "XFB at index 1, that is declared as empty, is missing. It was expected that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
               ,0x8d);
    local_1b8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (test_case_index != 1) {
      if (test_case_index != 0) {
        return true;
      }
      if (dVar3 != 0) {
        (**(code **)(lVar4 + 0x638))();
        glu::checkError(dVar3,"BeginTransformFeedback",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0x4dd2);
      }
      (**(code **)(lVar4 + 0x538))(0xe,0,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      (**(code **)(lVar4 + 0x638))();
      glu::checkError(dVar3,"DrawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0x4dd9);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"EndTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0x4dda);
      return true;
    }
    if (dVar3 == 0x502) {
      return true;
    }
    if (dVar3 == 0) {
      (**(code **)(lVar4 + 0x638))();
    }
    local_1a8._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "XFB at index 0, that is written by GS, is missing. It was expected that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
               ,0x89);
    local_1b8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool XFBStrideOfEmptyListTest::executeDrawCall(GLuint test_case_index)
{
	const Functions& gl		= m_context.getRenderContext().getFunctions();
	bool			 result = true;

	/* Draw */
	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	gl.beginTransformFeedback(GL_POINTS);
	GLenum error = gl.getError();
	switch (test_case_index)
	{
	case VALID:
		if (GL_NO_ERROR != error)
		{
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(error, "BeginTransformFeedback");
		}

		gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
		error = gl.getError();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(error, "DrawArrays");
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		break;

	case FIRST_MISSING:
		if (GL_NO_ERROR == error)
		{
			gl.endTransformFeedback();
		}

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "XFB at index 0, that is written by GS, is missing. It was expected that "
											"INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
				<< glu::getErrorStr(error) << tcu::TestLog::EndMessage;

			result = false;
		}

		break;

	case SECOND_MISSING:
		if (GL_NO_ERROR == error)
		{
			gl.endTransformFeedback();
		}

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "XFB at index 1, that is declared as empty, is missing. It was expected "
											"that INVALID_OPERATION will generated by BeginTransformFeedback. Got: "
				<< glu::getErrorStr(error) << tcu::TestLog::EndMessage;

			result = false;
		}

		break;
	}

	/* Done */
	return result;
}